

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_print_errors_cb(cb *cb,void *u)

{
  int iVar1;
  ERR_STATE *pEVar2;
  ulong uVar3;
  size_t len;
  char *local_4f0;
  unsigned_long thread_hash;
  uint local_4b0;
  uint32_t packed_error;
  int flags;
  int line;
  char *data;
  char *file;
  char buf2 [1024];
  char buf [120];
  void *ctx_local;
  ERR_print_errors_callback_t callback_local;
  
  pEVar2 = err_get_state();
  do {
    uVar3 = ERR_get_error_line_data(&data,(int *)&packed_error,(char **)&flags,(int *)&local_4b0);
    if ((int)uVar3 == 0) {
      return;
    }
    ERR_error_string_n(uVar3 & 0xffffffff,buf2 + 0x3f8,0x78);
    if ((local_4b0 & 1) == 0) {
      local_4f0 = "";
    }
    else {
      local_4f0 = _flags;
    }
    snprintf((char *)&file,0x400,"%lu:%s:%s:%d:%s\n",pEVar2,buf2 + 0x3f8,data,packed_error,local_4f0
            );
    len = strlen((char *)&file);
    iVar1 = (*cb)((char *)&file,len,u);
  } while (0 < iVar1);
  return;
}

Assistant:

void ERR_print_errors_cb(ERR_print_errors_callback_t callback, void *ctx) {
  char buf[ERR_ERROR_STRING_BUF_LEN];
  char buf2[1024];
  const char *file, *data;
  int line, flags;
  uint32_t packed_error;

  // thread_hash is the least-significant bits of the |ERR_STATE| pointer value
  // for this thread.
  const unsigned long thread_hash = (uintptr_t)err_get_state();

  for (;;) {
    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    if (packed_error == 0) {
      break;
    }

    ERR_error_string_n(packed_error, buf, sizeof(buf));
    snprintf(buf2, sizeof(buf2), "%lu:%s:%s:%d:%s\n", thread_hash, buf, file,
             line, (flags & ERR_FLAG_STRING) ? data : "");
    if (callback(buf2, strlen(buf2), ctx) <= 0) {
      break;
    }
  }
}